

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzgnames.cpp
# Opt level: O0

int32_t icu_63::hashPartialLocationKey(UHashTok key)

{
  int32_t iVar1;
  UnicodeString *pUVar2;
  char16_t srcChar;
  ConstChar16Ptr local_70 [3];
  undefined1 local_58 [8];
  UnicodeString str;
  PartialLocationKey *p;
  UHashTok key_local;
  
  str.fUnion._48_8_ = key;
  UnicodeString::UnicodeString((UnicodeString *)local_58,*key.pointer);
  pUVar2 = UnicodeString::append((UnicodeString *)local_58,L'&');
  ConstChar16Ptr::ConstChar16Ptr(local_70,*(char16_t **)(str.fUnion._48_8_ + 8));
  pUVar2 = UnicodeString::append(pUVar2,local_70,-1);
  pUVar2 = UnicodeString::append(pUVar2,L'#');
  srcChar = L'S';
  if (*(char *)(str.fUnion._48_8_ + 0x10) != '\0') {
    srcChar = L'L';
  }
  UnicodeString::append(pUVar2,srcChar);
  ConstChar16Ptr::~ConstChar16Ptr(local_70);
  iVar1 = UnicodeString::hashCode((UnicodeString *)local_58);
  UnicodeString::~UnicodeString((UnicodeString *)local_58);
  return iVar1;
}

Assistant:

static int32_t U_CALLCONV
hashPartialLocationKey(const UHashTok key) {
    // <tzID>&<mzID>#[L|S]
    PartialLocationKey *p = (PartialLocationKey *)key.pointer;
    UnicodeString str(p->tzID);
    str.append((UChar)0x26)
        .append(p->mzID, -1)
        .append((UChar)0x23)
        .append((UChar)(p->isLong ? 0x4C : 0x53));
    return str.hashCode();
}